

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickhull.hpp
# Opt level: O1

void __thiscall
quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
::replace_neighbour(quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
                    *this,size_type f,size_type _from,size_type _to)

{
  _Elt_pointer pfVar1;
  size_type *psVar2;
  ulong uVar3;
  
  if (_from != _to) {
    pfVar1 = (this->facets_).
             super__Deque_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar3 = ((long)pfVar1 -
             (long)(this->facets_).
                   super__Deque_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x2c8590b21642c859 + f
    ;
    if (uVar3 < 2) {
      pfVar1 = pfVar1 + f;
    }
    else {
      pfVar1 = (this->facets_).
               super__Deque_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar3 >> 1] +
               uVar3 + (uVar3 >> 1) * -2;
    }
    for (psVar2 = (pfVar1->neighbours_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        psVar2 != (pfVar1->neighbours_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish; psVar2 = psVar2 + 1) {
      if (*psVar2 == _from) {
        *psVar2 = _to;
        return;
      }
    }
  }
  return;
}

Assistant:

void
    replace_neighbour(size_type const f,
                      size_type const _from,
                      size_type const _to)
    {
        if (_from != _to) {
            for (size_type & n : facets_[f].neighbours_) {
                if (n == _from) {
                    n = _to;
                    return;
                }
            }
        }
    }